

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O3

QComboBoxPrivateContainer * __thiscall QComboBoxPrivate::viewContainer(QComboBoxPrivate *this)

{
  Data *pDVar1;
  QComboBox *cmb;
  long *plVar2;
  void **ppvVar3;
  QComboBoxPrivateContainer *pQVar4;
  QComboBoxListView *this_00;
  Data *pDVar5;
  undefined4 *puVar6;
  QItemSelectionModel *pQVar7;
  long lVar8;
  QObject *pQVar9;
  long in_FS_OFFSET;
  QObject *local_78;
  Connection local_70;
  QObject local_68 [8];
  QObject local_60 [8];
  code *local_58;
  ImplFn local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->container).wp.d;
  if ((pDVar1 == (Data *)0x0) ||
     (pQVar4 = (QComboBoxPrivateContainer *)(this->container).wp.value,
     pQVar4 == (QComboBoxPrivateContainer *)0x0 || *(int *)(pDVar1 + 4) == 0)) {
    cmb = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar4 = (QComboBoxPrivateContainer *)operator_new(0x80);
    this_00 = (QComboBoxListView *)operator_new(0x30);
    QComboBoxListView::QComboBoxListView(this_00,cmb);
    QComboBoxPrivateContainer::QComboBoxPrivateContainer(pQVar4,(QAbstractItemView *)this_00,cmb);
    pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar4);
    pDVar1 = (this->container).wp.d;
    (this->container).wp.d = pDVar5;
    (this->container).wp.value = (QObject *)pQVar4;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    lVar8 = 600;
    do {
      QObject::disconnect((Connection *)(&(this->super_QWidgetPrivate).super_QObjectPrivate + lVar8)
                         );
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x298);
    plVar2 = *(long **)((this->container).wp.value + 0x50);
    (**(code **)(*plVar2 + 0x1c8))(plVar2,this->model);
    connectModel(this);
    QAbstractItemView::setTextElideMode
              (*(QAbstractItemView **)((this->container).wp.value + 0x50),ElideMiddle);
    updateDelegate(this,true);
    updateLayoutDirection(this);
    updateViewContainerPaletteAndOpacity(this);
    pDVar1 = (this->container).wp.d;
    pQVar9 = (QObject *)0x0;
    if (pDVar1 == (Data *)0x0) {
      local_78 = (QObject *)0x0;
    }
    else if (*(int *)(pDVar1 + 4) == 0) {
      local_78 = (QObject *)0x0;
    }
    else {
      local_78 = (this->container).wp.value;
    }
    local_48 = QComboBoxPrivateContainer::itemSelected;
    local_40 = 0;
    local_58 = itemSelected;
    local_50 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = itemSelected;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_60,(void **)local_78,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_60);
    pQVar7 = QAbstractItemView::selectionModel
                       (*(QAbstractItemView **)((this->container).wp.value + 0x50));
    local_48 = QItemSelectionModel::currentChanged;
    local_40 = 0;
    local_58 = emitHighlighted;
    local_50 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QComboBoxPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar6 + 4) = emitHighlighted;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)pQVar7,(QObject *)&local_48,ppvVar3,(QSlotObjectBase *)&local_58,
               (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    pDVar1 = (this->container).wp.d;
    if (pDVar1 != (Data *)0x0) {
      if (*(int *)(pDVar1 + 4) == 0) {
        pQVar9 = (QObject *)0x0;
      }
      else {
        pQVar9 = (this->container).wp.value;
      }
    }
    local_48 = QComboBoxPrivateContainer::resetButton;
    local_40 = 0;
    local_58 = resetButton;
    local_50 = (ImplFn)0x0;
    ppvVar3 = *(void ***)&(this->super_QWidgetPrivate).field_0x8;
    puVar6 = (undefined4 *)operator_new(0x20);
    *puVar6 = 1;
    *(code **)(puVar6 + 2) =
         QtPrivate::QPrivateSlotObject<void_(QComboBoxPrivate::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar6 + 4) = resetButton;
    *(undefined8 *)(puVar6 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_70,(void **)pQVar9,(QObject *)&local_48,ppvVar3,
               (QSlotObjectBase *)&local_58,(ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection(&local_70);
    pDVar1 = (this->container).wp.d;
    pQVar4 = (QComboBoxPrivateContainer *)0x0;
    if (pDVar1 != (Data *)0x0) {
      if (*(int *)(pDVar1 + 4) == 0) {
        pQVar4 = (QComboBoxPrivateContainer *)0x0;
      }
      else {
        pQVar4 = (QComboBoxPrivateContainer *)(this->container).wp.value;
      }
    }
  }
  else if (*(int *)(pDVar1 + 4) == 0) {
    pQVar4 = (QComboBoxPrivateContainer *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QComboBoxPrivateContainer* QComboBoxPrivate::viewContainer()
{
    if (container)
        return container;

    Q_Q(QComboBox);
    container = new QComboBoxPrivateContainer(new QComboBoxListView(q), q);
    disconnectModel();
    container->itemView()->setModel(model);
    connectModel();
    container->itemView()->setTextElideMode(Qt::ElideMiddle);
    updateDelegate(true);
    updateLayoutDirection();
    updateViewContainerPaletteAndOpacity();
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::itemSelected,
                            this, &QComboBoxPrivate::itemSelected);
    QObjectPrivate::connect(container->itemView()->selectionModel(),
                            &QItemSelectionModel::currentChanged,
                            this, &QComboBoxPrivate::emitHighlighted);
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::resetButton,
                            this, &QComboBoxPrivate::resetButton);
    return container;
}